

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O2

back_insert_iterator<std::vector<int,_std::allocator<int>_>_>
get_simplex_vertices<std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
          (index_t idx,index_t dim,index_t v,binomial_coeff_table *binomial_coeff,
          back_insert_iterator<std::vector<int,_std::allocator<int>_>_> out)

{
  ulong uVar1;
  int local_2c;
  
  local_2c = v + -1;
  for (uVar1 = (ulong)(dim + 1); 0 < (index_t)uVar1; uVar1 = uVar1 - 1) {
    get_next_vertex(&local_2c,idx,(index_t)uVar1,binomial_coeff);
    std::vector<int,_std::allocator<int>_>::push_back(out.container,&local_2c);
    idx = idx - *(int *)(*(long *)&(binomial_coeff->B).
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[local_2c].
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar1 * 4
                        );
  }
  return (back_insert_iterator<std::vector<int,_std::allocator<int>_>_>)
         (back_insert_iterator<std::vector<int,_std::allocator<int>_>_>)out.container;
}

Assistant:

OutputIterator get_simplex_vertices(index_t idx, const index_t dim, index_t v,
                                    const binomial_coeff_table& binomial_coeff, OutputIterator out) {
	--v;
	for (index_t k = dim + 1; k > 0; --k) {
		get_next_vertex(v, idx, k, binomial_coeff);
		*out++ = v;
		idx -= binomial_coeff(v, k);
	}
	return out;
}